

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

bool __thiscall VCCluster::removeUnconnected(VCCluster *this,VCCluster *cNull)

{
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *p_Var1;
  VCFace *f;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *psVar2;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *psVar6;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar7;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  *__range1;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar8;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar9;
  iterator iVar10;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *__range3;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *this_00;
  ulong uVar11;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  components;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *comp;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> unvisited;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_a8;
  iterator iStack_a0;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_98;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *local_88;
  ulong local_80;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *local_78;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_70;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_68;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_60;
  
  local_a8 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  iStack_a0._M_current = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  local_98 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::_Rb_tree(&local_60,&(this->items)._M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppsVar9 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
    iVar10._M_current = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  }
  else {
    do {
      local_88 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)operator_new(0x30)
      ;
      p_Var5 = &(local_88->_M_t)._M_impl.super__Rb_tree_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      *(undefined8 *)&(local_88->_M_t)._M_impl = 0;
      *(undefined8 *)&(local_88->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      bfs(this,*(VCFace **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1),local_88,
          (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)&local_60);
      if (iStack_a0._M_current == local_98) {
        std::
        vector<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*,std::allocator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*>>
        ::_M_realloc_insert<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*const&>
                  ((vector<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*,std::allocator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*>>
                    *)&local_a8,iStack_a0,&local_88);
      }
      else {
        *iStack_a0._M_current = local_88;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      ppsVar9 = local_a8;
      iVar10._M_current = iStack_a0._M_current;
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  uVar11 = (long)iVar10._M_current - (long)ppsVar9;
  if (uVar11 < 9) {
    if (uVar11 != 8) goto LAB_00112971;
    this_00 = &(*ppsVar9)->_M_t;
  }
  else {
    ppsVar3 = ppsVar9 + 1;
    ppsVar7 = ppsVar9;
    if (ppsVar3 != iVar10._M_current && ppsVar9 != iVar10._M_current) {
      psVar6 = *ppsVar9;
      ppsVar8 = ppsVar9;
      do {
        ppsVar7 = ppsVar3;
        psVar2 = *ppsVar3;
        if (((*ppsVar3)->_M_t)._M_impl.super__Rb_tree_header._M_node_count <=
            (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
          ppsVar7 = ppsVar8;
          psVar2 = psVar6;
        }
        psVar6 = psVar2;
        ppsVar3 = ppsVar3 + 1;
        ppsVar8 = ppsVar7;
      } while (ppsVar3 != iVar10._M_current);
    }
    this_00 = &(*ppsVar7)->_M_t;
    local_80 = uVar11;
    p_Var1 = this_00;
    ppsVar3 = iVar10._M_current;
    if (ppsVar9 != iVar10._M_current) {
      do {
        local_70 = ppsVar3;
        local_78 = p_Var1;
        p_Var1 = &(*ppsVar9)->_M_t;
        if (p_Var1 != this_00) {
          local_68 = ppsVar9;
          for (p_Var4 = (p_Var1->_M_impl).super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(p_Var1->_M_impl).super__Rb_tree_header;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            f = *(VCFace **)(p_Var4 + 1);
            delItem(this,f);
            addItem(cNull,f);
          }
          std::
          _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
          ::~_Rb_tree(p_Var1);
          operator_delete(p_Var1);
          ppsVar9 = local_68;
          iVar10._M_current = local_70;
          this_00 = local_78;
        }
        ppsVar9 = ppsVar9 + 1;
        p_Var1 = local_78;
        ppsVar3 = local_70;
        uVar11 = local_80;
      } while (ppsVar9 != iVar10._M_current);
    }
  }
  if (this_00 !=
      (_Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
       *)0x0) {
    std::
    _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
    ::~_Rb_tree(this_00);
  }
  operator_delete(this_00);
LAB_00112971:
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&local_60);
  if (local_a8 != (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0) {
    operator_delete(local_a8);
  }
  return 8 < uVar11;
}

Assistant:

bool VCCluster::removeUnconnected(VCCluster* cNull) {
	vector< set<VCFace*> * > components;
	set<VCFace*> unvisited(items);
	while (!unvisited.empty()) {
		set<VCFace*>* comp = new set<VCFace*>();
		bfs(*unvisited.begin(), comp, &unvisited);
		components.push_back(comp);
	}
	if (components.size() <= 1) {
		if(components.size() == 1)
			delete components[0];
		return false;
	}
	set<VCFace*>* largest = *max_element(components.begin(), components.end(),
		[](set<VCFace*> * s1, set<VCFace*> * s2) -> bool { return s1->size() < s2->size(); });
	for (set<VCFace*>* s : components) {
		if (s != largest) {
			for (VCFace* item : *s) {
				giveItem(item, cNull);
			}
			delete s;
		}
	}
	delete largest;
	return true;
}